

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCapsuleShape.h
# Opt level: O3

void __thiscall
cbtCapsuleShape::getAabb
          (cbtCapsuleShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  cbtVector3 halfExtents;
  
  iVar3 = *(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  halfExtents.m_floats[0] =
       (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[(iVar3 + 2) % 3];
  halfExtents.m_floats[1] = halfExtents.m_floats[0];
  halfExtents.m_floats[2] = halfExtents.m_floats[0];
  halfExtents.m_floats[iVar3] =
       halfExtents.m_floats[0] +
       (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar3];
  auVar14._4_4_ = halfExtents.m_floats[0];
  auVar14._0_4_ = halfExtents.m_floats[0];
  auVar14._8_4_ = halfExtents.m_floats[0];
  auVar14._12_4_ = halfExtents.m_floats[0];
  fVar1 = (t->m_origin).m_floats[2];
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 1),
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]),0x10);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])(t->m_basis).m_el[0].m_floats,
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]),0x10);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 2),
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]),0x10);
  auVar9 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[1]),auVar12);
  auVar4 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]),auVar12);
  auVar5 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]),auVar12);
  auVar6 = vandps_avx(auVar6,auVar12);
  auVar7 = vandps_avx(auVar7,auVar12);
  auVar8 = vandps_avx(auVar8,auVar12);
  uVar2 = *(ulong *)(t->m_origin).m_floats;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar10._0_4_ = halfExtents.m_floats[1] * auVar6._0_4_;
  auVar10._4_4_ = halfExtents.m_floats[1] * auVar6._4_4_;
  auVar10._8_4_ = halfExtents.m_floats[1] * auVar6._8_4_;
  auVar10._12_4_ = halfExtents.m_floats[1] * auVar6._12_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(halfExtents.m_floats[1] * auVar9._0_4_)),auVar14,auVar4);
  auVar11._4_4_ = halfExtents.m_floats[2];
  auVar11._0_4_ = halfExtents.m_floats[2];
  auVar11._8_4_ = halfExtents.m_floats[2];
  auVar11._12_4_ = halfExtents.m_floats[2];
  auVar9 = vfmadd231ps_fma(auVar10,auVar14,auVar7);
  auVar4 = vfmadd231ps_fma(auVar9,auVar11,auVar8);
  auVar5 = vfmadd231ss_fma(auVar6,auVar11,auVar5);
  auVar9 = vsubps_avx(auVar13,auVar4);
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 - auVar5._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar9;
  auVar9._0_4_ = (float)uVar2 + auVar4._0_4_;
  auVar9._4_4_ = (float)(uVar2 >> 0x20) + auVar4._4_4_;
  auVar9._8_4_ = auVar4._8_4_ + 0.0;
  auVar9._12_4_ = auVar4._12_4_ + 0.0;
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + auVar5._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar9;
  return;
}

Assistant:

cbtScalar getRadius() const
	{
		int radiusAxis = (m_upAxis + 2) % 3;
		return m_implicitShapeDimensions[radiusAxis];
	}